

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O2

void * private_ACUtils_ADynArray_constructWithAllocator
                 (size_t typeSize,ACUtilsReallocator reallocator,ACUtilsDeallocator deallocator)

{
  undefined8 *puVar1;
  size_t sVar2;
  long lVar3;
  private_ACUtils_DynArray_Prototype *prototype;
  undefined8 *puVar4;
  
  if (deallocator == (ACUtilsDeallocator)0x0 || reallocator == (ACUtilsReallocator)0x0) {
    puVar4 = (undefined8 *)0x0;
  }
  else {
    sVar2 = 0x30;
    puVar1 = (undefined8 *)(*reallocator)((void *)0x0,0x30);
    puVar4 = (undefined8 *)0x0;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = reallocator;
      puVar1[1] = deallocator;
      puVar1[5] = 0;
      puVar1[2] = private_ACUtils_ADynArray_growStrategyDefault;
      puVar1[3] = 0;
      sVar2 = private_ACUtils_ADynArray_growStrategyDefault(0,sVar2);
      puVar1[4] = sVar2;
      lVar3 = (*(code *)*puVar1)(0,typeSize * sVar2);
      puVar1[5] = lVar3;
      puVar4 = puVar1;
      if (lVar3 == 0) {
        (*(code *)puVar1[1])(0);
        (*(code *)puVar1[1])(puVar1);
        puVar4 = (undefined8 *)0x0;
      }
    }
  }
  return puVar4;
}

Assistant:

ACUTILS_HD_FUNC void* private_ACUtils_ADynArray_constructWithAllocator(size_t typeSize, ACUtilsReallocator reallocator,
                                                                       ACUtilsDeallocator deallocator)
{
    struct private_ACUtils_DynArray_Prototype* prototype;
    if(reallocator == NULL || deallocator == NULL)
        return NULL;
    prototype = (struct private_ACUtils_DynArray_Prototype*) reallocator(NULL, sizeof(struct private_ACUtils_DynArray_Prototype));
    if(prototype != NULL) {
        struct private_ACUtils_DynArray_Prototype tmpPrototype = {reallocator, deallocator};
        memcpy(prototype, &tmpPrototype, sizeof(struct private_ACUtils_DynArray_Prototype));
        prototype->growStrategy = private_ACUtils_ADynArray_growStrategyDefault;
        prototype->size = 0;
        prototype->capacity = prototype->growStrategy(prototype->size, typeSize);
        prototype->buffer = (char*) prototype->reallocator(NULL, prototype->capacity * typeSize);
        if(prototype->buffer == NULL) {
            private_ACUtils_ADynArray_destruct(prototype);
            return NULL;
        }
    }
    return prototype;
}